

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retention.cc
# Opt level: O2

void google::protobuf::compiler::anon_unknown_0::ConvertToDynamicMessageAndStripOptions
               (Message *m,DescriptorPool *pool,
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *stripped_paths)

{
  bool bVar1;
  Descriptor *type;
  DescriptorPool *pDVar2;
  Message *this;
  MessageLite *this_00;
  string_view data;
  string_view sVar3;
  LogMessage LStack_a8;
  string serialized;
  vector<int,_std::allocator<int>_> path;
  DynamicMessageFactory factory;
  
  sVar3 = MessageLite::GetTypeName(&m->super_MessageLite);
  type = DescriptorPool::FindMessageTypeByName(pool,sVar3);
  path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (type != (Descriptor *)0x0) {
    pDVar2 = DescriptorPool::generated_pool();
    if (pDVar2 != pool) {
      DynamicMessageFactory::DynamicMessageFactory(&factory);
      this = DynamicMessageFactory::GetPrototype(&factory,type);
      this_00 = &Message::New(this)->super_MessageLite;
      serialized._M_dataplus._M_p = (pointer)&serialized.field_2;
      serialized._M_string_length = 0;
      serialized.field_2._M_local_buf[0] = '\0';
      bVar1 = MessageLite::SerializePartialToString(&m->super_MessageLite,&serialized);
      if (bVar1) {
        sVar3._M_str = serialized._M_dataplus._M_p;
        sVar3._M_len = serialized._M_string_length;
        bVar1 = MessageLite::ParsePartialFromString(this_00,sVar3);
        if (!bVar1) {
          bVar1 = absl::lts_20250127::log_internal::LogEveryNSecState::ShouldLog
                            (&compiler::(anonymous_namespace)::
                              ConvertToDynamicMessageAndStripOptions(google::protobuf::Message&,google::protobuf::DescriptorPool_const&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*)
                              ::absl_log_internal_stateful_condition_state,1.0);
          if (bVar1) {
            absl::lts_20250127::log_internal::LogMessage::LogMessage
                      (&LStack_a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention.cc"
                       ,0x7f);
            absl::lts_20250127::log_internal::LogMessage::operator<<
                      (&LStack_a8,(char (*) [47])"Failed to fully strip source-retention options");
            goto LAB_001b205c;
          }
          goto LAB_001b2064;
        }
        StripMessage((Message *)this_00,&path,stripped_paths);
        bVar1 = MessageLite::SerializePartialToString(this_00,&serialized);
        if (!bVar1) {
          bVar1 = absl::lts_20250127::log_internal::LogEveryNSecState::ShouldLog
                            (&compiler::(anonymous_namespace)::
                              ConvertToDynamicMessageAndStripOptions(google::protobuf::Message&,google::protobuf::DescriptorPool_const&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*)
                              ::absl_log_internal_stateful_condition_state,1.0);
          if (bVar1) {
            absl::lts_20250127::log_internal::LogMessage::LogMessage
                      (&LStack_a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention.cc"
                       ,0x86);
            absl::lts_20250127::log_internal::LogMessage::operator<<
                      (&LStack_a8,(char (*) [47])"Failed to fully strip source-retention options");
            goto LAB_001b205c;
          }
          goto LAB_001b2064;
        }
        data._M_str = serialized._M_dataplus._M_p;
        data._M_len = serialized._M_string_length;
        bVar1 = MessageLite::ParsePartialFromString(&m->super_MessageLite,data);
        if (!bVar1) {
          bVar1 = absl::lts_20250127::log_internal::LogEveryNSecState::ShouldLog
                            (&compiler::(anonymous_namespace)::
                              ConvertToDynamicMessageAndStripOptions(google::protobuf::Message&,google::protobuf::DescriptorPool_const&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>*)
                              ::absl_log_internal_stateful_condition_state,1.0);
          if (bVar1) {
            absl::lts_20250127::log_internal::LogMessage::LogMessage
                      (&LStack_a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention.cc"
                       ,0x8c);
            absl::lts_20250127::log_internal::LogMessage::operator<<
                      (&LStack_a8,(char (*) [47])"Failed to fully strip source-retention options");
            goto LAB_001b205c;
          }
          goto LAB_001b2064;
        }
        std::__cxx11::string::~string((string *)&serialized);
LAB_001b2083:
        (*this_00->_vptr_MessageLite[1])(this_00);
      }
      else {
        bVar1 = absl::lts_20250127::log_internal::LogEveryNSecState::ShouldLog
                          (&ConvertToDynamicMessageAndStripOptions::
                            absl_log_internal_stateful_condition_state,1.0);
        if (bVar1) {
          absl::lts_20250127::log_internal::LogMessage::LogMessage
                    (&LStack_a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention.cc"
                     ,0x79);
          absl::lts_20250127::log_internal::LogMessage::operator<<
                    (&LStack_a8,(char (*) [47])"Failed to fully strip source-retention options");
LAB_001b205c:
          absl::lts_20250127::log_internal::LogMessage::~LogMessage(&LStack_a8);
        }
LAB_001b2064:
        StripMessage(m,&path,stripped_paths);
        std::__cxx11::string::~string((string *)&serialized);
        if (this_00 != (MessageLite *)0x0) goto LAB_001b2083;
      }
      DynamicMessageFactory::~DynamicMessageFactory(&factory);
      goto LAB_001b2096;
    }
  }
  StripMessage(m,&path,stripped_paths);
LAB_001b2096:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&path.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void ConvertToDynamicMessageAndStripOptions(
    Message& m, const DescriptorPool& pool,
    std::vector<std::vector<int>>* stripped_paths = nullptr) {
  // We need to look up the descriptor in the pool so that we can get a
  // descriptor which knows about any custom options that were used in the
  // .proto file.
  const Descriptor* descriptor = pool.FindMessageTypeByName(m.GetTypeName());
  std::vector<int> path;

  if (descriptor == nullptr || &pool == DescriptorPool::generated_pool()) {
    // If the pool does not contain the descriptor, then this proto file does
    // not transitively depend on descriptor.proto, in which case we know there
    // are no custom options to worry about. If we are working with the
    // generated pool, then we can still access any custom options without
    // having to resort to DynamicMessage.
    StripMessage(m, path, stripped_paths);
  } else {
    // To convert to a dynamic message, we need to serialize the original
    // descriptor and parse it back again. This can fail if the descriptor is
    // invalid, so in that case we try to handle it gracefully by stripping the
    // original descriptor without using DynamicMessage. In this situation we
    // will generally not be able to strip custom options, but we can at least
    // strip built-in options.
    DynamicMessageFactory factory;
    std::unique_ptr<Message> dynamic_message(
        factory.GetPrototype(descriptor)->New());
    std::string serialized;
    if (!m.SerializePartialToString(&serialized)) {
      ABSL_LOG_EVERY_N_SEC(ERROR, 1)
          << "Failed to fully strip source-retention options";
      StripMessage(m, path, stripped_paths);
      return;
    }
    if (!dynamic_message->ParsePartialFromString(serialized)) {
      ABSL_LOG_EVERY_N_SEC(ERROR, 1)
          << "Failed to fully strip source-retention options";
      StripMessage(m, path, stripped_paths);
      return;
    }
    StripMessage(*dynamic_message, path, stripped_paths);
    if (!dynamic_message->SerializePartialToString(&serialized)) {
      ABSL_LOG_EVERY_N_SEC(ERROR, 1)
          << "Failed to fully strip source-retention options";
      StripMessage(m, path, stripped_paths);
      return;
    }
    if (!m.ParsePartialFromString(serialized)) {
      ABSL_LOG_EVERY_N_SEC(ERROR, 1)
          << "Failed to fully strip source-retention options";
      StripMessage(m, path, stripped_paths);
      return;
    }
  }
}